

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderMBlurSAH<4,_embree::Instance,_embree::InstancePrimitive>::build
          (BVHNBuilderMBlurSAH<4,_embree::Instance,_embree::InstancePrimitive> *this)

{
  Scene *pSVar1;
  GTypeMask GVar2;
  BVHN<4> *this_00;
  uint uVar3;
  EVP_PKEY_CTX *ctx;
  double t0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pSVar1 = this->scene;
  GVar2 = this->gtype_;
  uVar3 = (uint)GVar2;
  if ((uVar3 >> 0x14 & 1) == 0) {
    ctx = (EVP_PKEY_CTX *)0x0;
  }
  else {
    ctx = (EVP_PKEY_CTX *)(pSVar1->world).numMBTriangles;
  }
  if ((uVar3 >> 0x15 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBQuads;
  }
  if ((GVar2 & MTY_CURVE2) != ~MTY_ALL) {
    ctx = ctx + (pSVar1->world).numMBLineSegments;
  }
  if ((GVar2 & MTY_CURVE4) != ~MTY_ALL) {
    ctx = ctx + (pSVar1->world).numMBBezierCurves;
  }
  if ((GVar2 & MTY_POINTS) != ~MTY_ALL) {
    ctx = ctx + (pSVar1->world).numMBPoints;
  }
  if ((uVar3 >> 0x17 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBSubdivPatches;
  }
  if ((uVar3 >> 0x1d & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBUserGeometries;
  }
  if ((uVar3 >> 0x1e & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBInstancesCheap;
  }
  if ((int)uVar3 < 0) {
    ctx = ctx + (pSVar1->world).numMBInstancesExpensive;
  }
  if ((uVar3 >> 0x18 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBInstanceArrays;
  }
  if ((uVar3 >> 0x16 & 1) != 0) {
    ctx = ctx + (pSVar1->world).numMBGrids;
  }
  this_00 = this->bvh;
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    std::__cxx11::to_string(&local_40,4);
    std::operator+(&local_80,"avx::BVH",&local_40);
    std::operator+(&local_60,&local_80,"BuilderMBlurSAH");
    t0 = BVHN<4>::preBuild(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    buildMultiSegment(this,(size_t)ctx);
    BVHN<4>::cleanup(this->bvh,ctx);
    BVHN<4>::postBuild(this->bvh,t0);
    return;
  }
  (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
  return;
}

Assistant:

void build()
      {
	/* skip build for empty scene */
        const size_t numPrimitives = scene->getNumPrimitives(gtype_,true);
        if (numPrimitives == 0) { bvh->clear(); return; }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "BuilderMBlurSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            //const size_t numTimeSteps = scene->getNumTimeSteps<typename Mesh::type_t,true>();
            //const size_t numTimeSegments = numTimeSteps-1; assert(numTimeSteps > 1);

            /*if (numTimeSegments == 1)
              buildSingleSegment(numPrimitives);
              else*/
              buildMultiSegment(numPrimitives);

#if PROFILE
          });
#endif

	/* clear temporary data for static geometry */
	bvh->cleanup();
        bvh->postBuild(t0);
      }